

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::multisample::
MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates>::
uploadVertexData(MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates>
                 *this,Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton)

{
  void *dst;
  VertexDataNdcBarycentric *src;
  Vector<float,_3> local_f0;
  Vector<float,_4> local_e4;
  VertexDataNdcBarycentric local_d4;
  Vector<float,_3> local_b8;
  Vector<float,_4> local_ac;
  VertexDataNdcBarycentric local_9c;
  Vector<float,_3> local_80 [2];
  Vector<float,_4> local_64;
  VertexDataNdcBarycentric local_54;
  undefined1 local_38 [8];
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  vertices;
  VertexDataDesc *vertexDataDescripton_local;
  Allocation *vertexBufferAllocation_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates> *this_local;
  
  vertices.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)vertexDataDescripton;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::vector((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
            *)local_38);
  tcu::Vector<float,_4>::Vector(&local_64,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_3>::Vector(local_80,0.0,0.0,1.0);
  VertexDataNdcBarycentric::VertexDataNdcBarycentric(&local_54,&local_64,local_80);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
               *)local_38,&local_54);
  tcu::Vector<float,_4>::Vector(&local_ac,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_3>::Vector(&local_b8,1.0,0.0,0.0);
  VertexDataNdcBarycentric::VertexDataNdcBarycentric(&local_9c,&local_ac,&local_b8);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
               *)local_38,&local_9c);
  tcu::Vector<float,_4>::Vector(&local_e4,1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_3>::Vector(&local_f0,0.0,1.0,0.0);
  VertexDataNdcBarycentric::VertexDataNdcBarycentric(&local_d4,&local_e4,&local_f0);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
               *)local_38,&local_d4);
  dst = ::vk::Allocation::getHostPtr(vertexBufferAllocation);
  src = dataPointer<vkt::pipeline::multisample::VertexDataNdcBarycentric>
                  ((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
                    *)local_38);
  ::deMemcpy(dst,src,*(size_t *)
                      ((vertices.
                        super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->barycentricCoord).
                      m_data);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::~vector((vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
             *)local_38);
  return;
}

Assistant:

void MSInstance<MSInstanceInterpolateBarycentricCoordinates>::uploadVertexData (const Allocation& vertexBufferAllocation, const VertexDataDesc& vertexDataDescripton) const
{
	// Create buffer storing vertex data
	std::vector<VertexDataNdcBarycentric> vertices;

	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec3(0.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec3(1.0f, 0.0f, 0.0f)));
	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec3(0.0f, 1.0f, 0.0f)));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}